

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O1

bool __thiscall Kernel::RobSubstitution::isUnbound(RobSubstitution *this,VarSpec v)

{
  ulong uVar1;
  bool bVar2;
  Entry *pEVar3;
  byte unaff_BPL;
  VarSpec local_28;
  
  local_28._self = v._self._content;
  local_28.index = v.index;
  do {
    pEVar3 = ::Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry(&this->_bindings,&local_28);
    if (pEVar3 == (Entry *)0x0) {
      bVar2 = false;
      unaff_BPL = 1;
    }
    else {
      uVar1 = (pEVar3->_val).term._content;
      if ((uVar1 & 3) == 0) {
        bVar2 = false;
        unaff_BPL = 0;
      }
      else {
        local_28.index = (pEVar3->_val).index;
        bVar2 = true;
        local_28._self._content = uVar1;
      }
    }
  } while (bVar2);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool RobSubstitution::isUnbound(VarSpec v) const
{
  for(;;) {
    auto binding = _bindings.find(v);
    if(binding.isNone()) {
      return true;
    } else if(binding->isTerm()) {
      return false;
    }
    v = binding->varSpec();
  }
}